

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_count_scanner.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnCountResult::ColumnCountResult
          (ColumnCountResult *this,CSVStates *states,CSVStateMachine *state_machine,
          idx_t result_size,CSVErrorHandler *error_handler)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ScannerResult).quoted = false;
  (this->super_ScannerResult).unquoted = false;
  (this->super_ScannerResult).escaped = false;
  (this->super_ScannerResult).comment = false;
  (this->super_ScannerResult).quoted_position = 0;
  (this->super_ScannerResult).last_position.buffer_pos = 0;
  (this->super_ScannerResult).last_position.buffer_size = 0;
  (this->super_ScannerResult).last_position.buffer_idx = 0;
  (this->super_ScannerResult).result_size = result_size;
  (this->super_ScannerResult).state_machine = state_machine;
  (this->super_ScannerResult).states = states;
  this->result_position = 0;
  this->cur_line_starts_as_comment = false;
  p_Var1 = &(this->rows_per_column_count)._M_t._M_impl.super__Rb_tree_header;
  (this->rows_per_column_count)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rows_per_column_count)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->column_counts).super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
  super__Vector_base<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_counts).super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
  super__Vector_base<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_counts).super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>.
  super__Vector_base<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->current_column_count = 0;
  this->error = false;
  this->cur_buffer_idx = 0;
  this->current_buffer_size = 0;
  (this->rows_per_column_count)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->rows_per_column_count)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->rows_per_column_count)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->error_handler = error_handler;
  p_Var1 = &(this->buffer_handles)._M_t._M_impl.super__Rb_tree_header;
  (this->buffer_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->buffer_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->buffer_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->buffer_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->buffer_handles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ::std::vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>::resize
            (&(this->column_counts).
              super_vector<duckdb::ColumnCount,_std::allocator<duckdb::ColumnCount>_>,result_size);
  return;
}

Assistant:

ColumnCountResult::ColumnCountResult(CSVStates &states, CSVStateMachine &state_machine, idx_t result_size,
                                     CSVErrorHandler &error_handler)
    : ScannerResult(states, state_machine, result_size), error_handler(error_handler) {
	column_counts.resize(result_size);
}